

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ccallback.c
# Opt level: O0

void * lj_ccallback_new(CTState *cts,CType *ct,GCfunc *fn)

{
  GCtab *t_00;
  uint64_t uVar1;
  MSize slot_00;
  CType *ct_00;
  TValue *local_c8;
  GCtab *t;
  MSize slot;
  GCfunc *fn_local;
  CType *ct_local;
  CTState *cts_local;
  GCobj *o;
  
  ct_00 = callback_checkfunc(cts,ct);
  if (ct_00 == (CType *)0x0) {
    cts_local = (CTState *)0x0;
  }
  else {
    slot_00 = callback_slot_new(cts,ct_00);
    t_00 = cts->miscmap;
    if (slot_00 < t_00->asize) {
      local_c8 = (TValue *)((t_00->array).ptr64 + (long)(int)slot_00 * 8);
    }
    else {
      local_c8 = lj_tab_setinth(cts->L,t_00,slot_00);
    }
    local_c8->u64 = (ulong)fn | 0xfffb800000000000;
    if ((t_00->marked & 4) != 0) {
      uVar1 = (cts->L->glref).ptr64;
      t_00->marked = t_00->marked & 0xfb;
      (t_00->gclist).gcptr64 = *(uint64_t *)(uVar1 + 0x40);
      *(GCtab **)(uVar1 + 0x40) = t_00;
    }
    cts_local = (CTState *)callback_slot2ptr(cts,slot_00);
  }
  return cts_local;
}

Assistant:

void *lj_ccallback_new(CTState *cts, CType *ct, GCfunc *fn)
{
  ct = callback_checkfunc(cts, ct);
  if (ct) {
    MSize slot = callback_slot_new(cts, ct);
    GCtab *t = cts->miscmap;
    setfuncV(cts->L, lj_tab_setint(cts->L, t, (int32_t)slot), fn);
    lj_gc_anybarriert(cts->L, t);
    return callback_slot2ptr(cts, slot);
  }
  return NULL;  /* Bad conversion. */
}